

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O2

int identify_pack(int id_limit)

{
  boolean bVar1;
  uint uVar2;
  char *pcVar3;
  obj *otmp;
  long lVar4;
  int iVar5;
  obj **ppoVar6;
  object_pick *pick_list;
  char local_138 [264];
  
  otmp = (obj *)0x0;
  ppoVar6 = &invent;
  iVar5 = 0;
  while (ppoVar6 = &((obj *)ppoVar6)->nobj->nobj, (obj *)ppoVar6 != (obj *)0x0) {
    bVar1 = not_fully_identified((obj *)ppoVar6);
    if (bVar1 != '\0') {
      otmp = (obj *)ppoVar6;
    }
    iVar5 = iVar5 + (uint)(bVar1 != '\0');
  }
  if (iVar5 == 0) {
    iVar5 = 0;
    pline("You have already identified all of your possessions.");
  }
  else {
    if (id_limit != 0) {
      iVar5 = 0;
      pcVar3 = "first";
      do {
        while( true ) {
          if (id_limit == 0) goto LAB_001a97f1;
          sprintf(local_138,"What would you like to identify %s?",pcVar3);
          uVar2 = query_objlist(local_138,invent,0x1c,&pick_list,2,not_fully_identified);
          pcVar3 = "next";
          if (0 < (int)uVar2) break;
          id_limit = 0;
          if ((int)uVar2 < 0) {
            id_limit = 0;
            pline("That was all.");
            pcVar3 = "next";
          }
        }
        if (id_limit <= (int)uVar2) {
          uVar2 = id_limit;
        }
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        for (lVar4 = 0; (ulong)uVar2 << 4 != lVar4; lVar4 = lVar4 + 0x10) {
          identify(*(obj **)((long)&pick_list->obj + lVar4));
        }
        iVar5 = iVar5 + uVar2;
        free(pick_list);
        uVar2 = id_limit - uVar2;
        id_limit = 0;
        if (uVar2 != 0) {
          (*windowprocs.win_pause)(P_MESSAGE);
          pcVar3 = "next";
          id_limit = uVar2;
        }
      } while( true );
    }
    if (iVar5 == 1) {
      identify(otmp);
      iVar5 = 1;
    }
    else {
      iVar5 = 0;
      ppoVar6 = &invent;
      while (ppoVar6 = &((obj *)ppoVar6)->nobj->nobj, (obj *)ppoVar6 != (obj *)0x0) {
        bVar1 = not_fully_identified((obj *)ppoVar6);
        if (bVar1 != '\0') {
          identify((obj *)ppoVar6);
          iVar5 = iVar5 + 1;
        }
      }
    }
  }
LAB_001a97f1:
  update_inventory();
  return iVar5;
}

Assistant:

int identify_pack(int id_limit)
{
    struct obj *obj, *the_obj;
    int unid_cnt;
    int num_identified = 0;

    unid_cnt = 0;
    the_obj = 0;		/* if unid_cnt ends up 1, this will be it */
    for (obj = invent; obj; obj = obj->nobj)
	if (not_fully_identified(obj)) ++unid_cnt, the_obj = obj;

    if (!unid_cnt) {
	pline("You have already identified all of your possessions.");
    } else if (!id_limit) {
	/* identify everything */
	if (unid_cnt == 1) {
	    identify(the_obj);
	    num_identified = 1;
	} else {
	    /* TODO:  use fully_identify_obj and cornline/menu/whatever here */
	    for (obj = invent; obj; obj = obj->nobj) {
		if (not_fully_identified(obj)) {
		    identify(obj);
		    num_identified++;
		}
	    }
	}
    } else {
	/* identify up to `id_limit' items */
	num_identified = menu_identify(id_limit);
    }
    update_inventory();

    return num_identified;
}